

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool set_voice_dir_and_voice(OpenJTalk *oj,char *path)

{
  _Bool _Var1;
  size_t sVar2;
  char *pcVar3;
  OpenJTalk *in_RSI;
  char *in_RDI;
  char temp [260];
  OpenJTalk *in_stack_00000108;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  _Var1 = set_voice_dir_path(in_stack_00000108,stack0x00000100);
  if (_Var1) {
    if ((in_RDI != (char *)0xfffffffffffffdf0) && (sVar2 = strlen(in_RDI + 0x210), sVar2 != 0)) {
      pcVar3 = get_fname((char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                         in_RDI);
      if (pcVar3 == (char *)0x0) {
        in_RDI[0x678] = '\v';
        in_RDI[0x679] = '\0';
        in_RDI[0x67a] = '\0';
        in_RDI[0x67b] = '\0';
        return false;
      }
      _Var1 = set_voice_name(in_stack_00000108,stack0x00000100);
      if (!_Var1) {
        _Var1 = set_default_voice(in_RSI);
        return _Var1;
      }
      return true;
    }
    _Var1 = set_default_voice(in_RSI);
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool set_voice_dir_and_voice(OpenJTalk *oj, const char *path)
{
	char temp[MAX_PATH];

	if (!set_voice_dir_path(oj, path))
	{
		return false;
	}

	if (!oj->fn_voice_path || strlen(oj->fn_voice_path) == 0)
	{
		return set_default_voice(oj);
	}

	if (get_fname(oj->fn_voice_path, temp) == NULL)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return false;
	}

	if (set_voice_name(oj, temp))
	{
		return true;
	}

	return set_default_voice(oj);
}